

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_layout.cpp
# Opt level: O2

void tst_layoutnode_horizontal_grid(void)

{
  undefined8 uVar1;
  RectangleNode *pRVar2;
  RectangleNode *pRVar3;
  RectangleNode *pRVar4;
  Node *this;
  Node *child;
  ostream *poVar5;
  char *pcVar6;
  int i;
  long lVar7;
  float fVar8;
  rect2d r_00;
  rect2d r_01;
  rect2d r_02;
  rect2d r_03;
  rect2d r_04;
  rect2d r_05;
  rect2d r_06;
  rect2d r_07;
  rect2d r_08;
  rect2d r_09;
  rect2d r_10;
  rect2d r_11;
  rect2d r_12;
  rect2d r_13;
  rect2d r_14;
  rect2d r_15;
  rect2d r_16;
  rect2d r_17;
  rect2d r_18;
  rect2d r_19;
  rect2d r_20;
  rect2d r_21;
  rect2d r_22;
  rect2d r_23;
  rect2d r_24;
  rect2d r_25;
  rect2d r_26;
  rect2d r_27;
  rect2d r_28;
  rect2d r_29;
  rect2d r_30;
  rect2d r_31;
  rect2d r_32;
  rect2d r_33;
  rect2d r_34;
  rect2d r_35;
  rect2d r_36;
  rect2d r_37;
  rect2d r_38;
  rect2d r_39;
  rect2d r_40;
  rect2d r_41;
  rect2d r_42;
  rect2d r_43;
  rect2d r_44;
  rect2d r_45;
  rect2d r_46;
  rect2d r_47;
  rect2d r_48;
  rect2d r_49;
  rect2d r_50;
  rect2d r_51;
  rect2d r_52;
  rect2d r_53;
  rect2d r_54;
  rect2d r_55;
  rect2d r_56;
  rect2d r_57;
  rect2d r_58;
  rect2d r_59;
  rect2d r_60;
  rect2d r_61;
  rect2d r_62;
  rect2d r_63;
  rect2d r_64;
  rect2d r_65;
  rect2d r_66;
  rect2d r_67;
  rect2d r_68;
  rect2d r_69;
  rect2d r_70;
  rect2d r_71;
  rect2d r_72;
  rect2d r_73;
  rect2d r_74;
  rect2d r_75;
  rect2d r_76;
  rect2d r_77;
  rect2d r_78;
  rect2d r_79;
  rect2d r_80;
  rect2d r_81;
  rect2d r_82;
  rect2d r_83;
  rect2d r_84;
  rect2d r_85;
  rect2d r_86;
  rect2d r_87;
  rect2d r_88;
  rect2d r_89;
  rect2d r_90;
  rect2d r_91;
  rect2d r_92;
  rect2d r_93;
  rect2d r_94;
  rect2d r_95;
  rect2d r_96;
  rect2d r_97;
  rect2d r_98;
  rect2d r_99;
  rect2d r_x00100;
  rect2d r_x00101;
  rect2d r_x00102;
  rect2d r_x00103;
  rect2d r_x00104;
  rect2d r_x00105;
  rect2d r_x00106;
  rect2d r_x00107;
  rect2d r_x00108;
  rect2d r_x00109;
  rect2d r_x00110;
  rect2d r_x00111;
  rect2d r_x00112;
  rect2d r_x00113;
  rect2d r_x00114;
  rect2d r_x00115;
  rect2d r_x00116;
  rect2d r_x00117;
  rect2d r_x00118;
  rect2d r_x00119;
  RectangleNode *local_58;
  RectangleNode *r [4];
  
  this = &rengine::LayoutNode::create()->super_Node;
  rengine::LayoutNode::setActivationMode((LayoutNode *)this,Explicit);
  rengine::LayoutNode::setLayoutType((LayoutNode *)this,Grid_Horizontal);
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    child = (Node *)rengine::RectangleNode::create();
    r[lVar7 + -1] = (RectangleNode *)child;
    rengine::Node::append(this,child);
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,0,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
     (NAN(fVar8))) {
LAB_0010c8be:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)(ZEXT816(0x41a0000041200000) << 0x40));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) {
LAB_00115277:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8b,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0)) ||
       (NAN(fVar8))) goto LAB_00115277;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_0010c8be;
  }
  pRVar2 = r[0];
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010c9c4:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_00.br.x = 20.0;
    r_00.br.y = 20.0;
    r_00.tl.x = 10.0;
    r_00.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_00);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) {
LAB_00115296:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115296;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010c9c4;
  }
  pRVar3 = r[1];
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010cacd:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_01.br.x = 30.0;
    r_01.br.y = 20.0;
    r_01.tl.x = 20.0;
    r_01.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_01);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_001152b5:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_001152b5;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)
        ) || (NAN(fVar8))) goto LAB_0010cacd;
  }
  pRVar4 = r[2];
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
     || (NAN(fVar8))) {
LAB_0010cbd9:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_02.br.x = 40.0;
    r_02.br.y = 20.0;
    r_02.tl.x = 30.0;
    r_02.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_02);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_001152d4:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 40.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)
        ) || (NAN(fVar8))) goto LAB_001152d4;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 40.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010cbd9;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,0,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
      (NAN(fVar8))))) {
LAB_0010cd05:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_03.br.x = 0.0;
    r_03.br.y = 20.0;
    r_03.tl.x = -10.0;
    r_03.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_03);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) {
LAB_001152f3:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x90,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_001152f3;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_0010cd05;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010ce05:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_04.br.x = -10.0;
    r_04.br.y = 20.0;
    r_04.tl.x = -20.0;
    r_04.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_04);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) {
LAB_00115312:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x91,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115312;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) goto LAB_0010ce05;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
     || (NAN(fVar8))) {
LAB_0010cf0b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_05.br.x = -20.0;
    r_05.br.y = 20.0;
    r_05.tl.x = -30.0;
    r_05.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_05);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) {
LAB_00115331:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x92,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) goto LAB_00115331;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010cf0b;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -40.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010d013:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_06.br.x = -30.0;
    r_06.br.y = 20.0;
    r_06.tl.x = -40.0;
    r_06.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_06);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -40.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) {
LAB_00115350:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x93,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115350;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010d013;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,0,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
      (NAN(fVar8))))) {
LAB_0010d13b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)ZEXT816(0xc1a00000c1200000));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
        (NAN(fVar8))))) {
LAB_0011536f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x95,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_0011536f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) goto LAB_0010d13b;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)
      ) || (NAN(fVar8))) {
LAB_0010d236:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_07.br.x = -10.0;
    r_07.tl.x = -20.0;
    r_07.tl.y = -20.0;
    r_07.br.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_07);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0011538e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x96,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) goto LAB_0011538e;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010d236;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -30.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010d33b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_08.br.x = -20.0;
    r_08.br.y = 0.0;
    r_08.tl.x = -30.0;
    r_08.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_08);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -30.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_001153ad:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x97,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_001153ad;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010d33b;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -40.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010d443:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_09.br.x = -30.0;
    r_09.br.y = 0.0;
    r_09.tl.x = -40.0;
    r_09.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_09);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -40.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_001153cc:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x98,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_001153cc;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) goto LAB_0010d443;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,0,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0)) ||
     (NAN(fVar8))) {
LAB_0010d56f:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_10.br.x = 10.0;
    r_10.br.y = 0.0;
    r_10.tl.x = 0.0;
    r_10.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_10);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
        (NAN(fVar8))))) {
LAB_001153eb:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9a,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) goto LAB_001153eb;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_0010d56f;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010d673:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_11.br.x = 20.0;
    r_11.br.y = 0.0;
    r_11.tl.x = 10.0;
    r_11.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_11);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_0011540a:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9b,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0011540a;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010d673;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010d779:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_12.br.x = 30.0;
    r_12.br.y = 0.0;
    r_12.tl.x = 20.0;
    r_12.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_12);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115429:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00115429;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) goto LAB_0010d779;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0))
     || (NAN(fVar8))) {
LAB_0010d881:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_13.br.x = 40.0;
    r_13.br.y = 0.0;
    r_13.tl.x = 30.0;
    r_13.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_13);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 30.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115448:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 40.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) goto LAB_00115448;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 40.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010d881;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,0,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
      (NAN(fVar8))))) {
LAB_0010d9b8:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_14.br.x = 11.0;
    r_14.br.y = 21.0;
    r_14.tl.x = 1.0;
    r_14.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_14);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0)) ||
       (NAN(fVar8))) {
LAB_00115467:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa1,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_00115467;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_0010d9b8;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0010dac0:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_15.br.x = 23.0;
    r_15.br.y = 21.0;
    r_15.tl.x = 13.0;
    r_15.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_15);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_00115486:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115486;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)
        ) || (NAN(fVar8))) goto LAB_0010dac0;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 25.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
     || (NAN(fVar8))) {
LAB_0010dbcb:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_16.br.x = 35.0;
    r_16.br.y = 21.0;
    r_16.tl.x = 25.0;
    r_16.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_16);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_001154a5:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 35.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)
        ) || (NAN(fVar8))) goto LAB_001154a5;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 35.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0010dbcb;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 37.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0010dcd8:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_17.br.x = 47.0;
    r_17.br.y = 21.0;
    r_17.tl.x = 37.0;
    r_17.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_17);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 37.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
       || (NAN(fVar8))) {
LAB_001154c4:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_001154c4;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0010dcd8;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,0,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
      (NAN(fVar8))))) {
LAB_0010de13:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_18.br.x = -1.0;
    r_18.br.y = 21.0;
    r_18.tl.x = -11.0;
    r_18.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_18);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
        (NAN(fVar8))))) {
LAB_001154e3:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa6,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_001154e3;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0)) ||
       (NAN(fVar8))) goto LAB_0010de13;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
     || (NAN(fVar8))) {
LAB_0010df1c:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_19.br.x = -13.0;
    r_19.br.y = 21.0;
    r_19.tl.x = -23.0;
    r_19.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_19);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_00115502:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)) || (NAN(fVar8))) goto LAB_00115502;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0010df1c;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -35.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0010e027:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_20.br.x = -25.0;
    r_20.br.y = 21.0;
    r_20.tl.x = -35.0;
    r_20.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_20);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -35.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0)
        ) || (NAN(fVar8))) {
LAB_00115521:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115521;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0010e027;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -47.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0010e134:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_21.br.x = -37.0;
    r_21.br.y = 21.0;
    r_21.tl.x = -47.0;
    r_21.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_21);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -47.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0)
        ) || (NAN(fVar8))) {
LAB_00115540:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -37.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115540;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -37.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)) || (NAN(fVar8))) goto LAB_0010e134;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,0,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
     (NAN(fVar8))) {
LAB_0010e26f:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_22.br.x = -1.0;
    r_22.br.y = -1.0;
    r_22.tl.x = -11.0;
    r_22.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_22);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
       (NAN(fVar8))) {
LAB_0011555f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xab,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0)) ||
       (NAN(fVar8))) goto LAB_0011555f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_0010e26f;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0010e377:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_23.br.x = -13.0;
    r_23.br.y = -1.0;
    r_23.tl.x = -23.0;
    r_23.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_23);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -23.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)) || (NAN(fVar8))) {
LAB_0011557e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xac,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0011557e;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0010e377;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -35.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0010e482:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_24.br.x = -25.0;
    r_24.br.y = -1.0;
    r_24.tl.x = -35.0;
    r_24.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_24);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -35.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0011559d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xad,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0011559d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -25.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)) || (NAN(fVar8))) goto LAB_0010e482;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -47.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)
      ) || (NAN(fVar8))) {
LAB_0010e58f:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_25.br.x = -37.0;
    r_25.br.y = -1.0;
    r_25.tl.x = -47.0;
    r_25.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_25);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_001155bc:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xae,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -37.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)) || (NAN(fVar8))) goto LAB_001155bc;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -37.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0010e58f;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,0,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
      (NAN(fVar8))))) {
LAB_0010e6ca:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_26.br.x = 11.0;
    r_26.br.y = -1.0;
    r_26.tl.x = 1.0;
    r_26.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_26);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
       (NAN(fVar8))) {
LAB_001155db:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb0,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_001155db;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_0010e6ca;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0010e7d3:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_27.br.x = 23.0;
    r_27.br.y = -1.0;
    r_27.tl.x = 13.0;
    r_27.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_27);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_001155fa:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb1,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_001155fa;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)
        ) || (NAN(fVar8))) goto LAB_0010e7d3;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 25.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0))
     || (NAN(fVar8))) {
LAB_0010e8de:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_28.br.x = 35.0;
    r_28.br.y = -1.0;
    r_28.tl.x = 25.0;
    r_28.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_28);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00115619:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 35.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)
        ) || (NAN(fVar8))) goto LAB_00115619;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 35.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0010e8de;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 37.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0010e9eb:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_29.br.x = 47.0;
    r_29.br.y = -1.0;
    r_29.tl.x = 37.0;
    r_29.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_29);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 37.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)) || (NAN(fVar8))) {
LAB_00115638:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_00115638;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0010e9eb;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,40.0,20.0,0.0,0.0,1,4,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 0.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
      (NAN(fVar8))))) {
LAB_0010eb1e:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)(ZEXT816(0x41a0000041200000) << 0x40));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) {
LAB_00115657:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb7,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_00115657;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0)) ||
       (NAN(fVar8))) goto LAB_0010eb1e;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
     || (NAN(fVar8))) {
LAB_0010ec20:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_30.br.x = 20.0;
    r_30.br.y = 20.0;
    r_30.tl.x = 10.0;
    r_30.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_30);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) {
LAB_00115676:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)
        ) || (NAN(fVar8))) goto LAB_00115676;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010ec20;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010ed25:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_31.br.x = 30.0;
    r_31.br.y = 20.0;
    r_31.tl.x = 20.0;
    r_31.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_31);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) {
LAB_00115695:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115695;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010ed25;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 30.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010ee2d:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_32.br.x = 40.0;
    r_32.br.y = 20.0;
    r_32.tl.x = 30.0;
    r_32.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_32);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_001156b4:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xba,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 40.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_001156b4;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 40.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)
        ) || (NAN(fVar8))) goto LAB_0010ee2d;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-40.0,20.0,0.0,0.0,1,4,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
     (NAN(fVar8))) {
LAB_0010ef5e:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_33.br.x = 0.0;
    r_33.br.y = 20.0;
    r_33.tl.x = -10.0;
    r_33.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_33);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) {
LAB_001156d3:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbc,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0)) ||
       (NAN(fVar8))) goto LAB_001156d3;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_0010ef5e;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010f05e:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_34.br.x = -10.0;
    r_34.br.y = 20.0;
    r_34.tl.x = -20.0;
    r_34.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_34);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) {
LAB_001156f2:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_001156f2;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010f05e;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -30.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0010f164:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_35.br.x = -20.0;
    r_35.br.y = 20.0;
    r_35.tl.x = -30.0;
    r_35.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_35);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_00115711:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbe,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115711;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) goto LAB_0010f164;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -40.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
     || (NAN(fVar8))) {
LAB_0010f26c:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_36.br.x = -30.0;
    r_36.br.y = 20.0;
    r_36.tl.x = -40.0;
    r_36.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_36);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -40.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_00115730:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -30.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) goto LAB_00115730;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_0010f26c;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-40.0,-20.0,0.0,0.0,1,4,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
      (NAN(fVar8))))) {
LAB_0010f399:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)ZEXT816(0xc1a00000c1200000));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0)) ||
       (NAN(fVar8))) {
LAB_0011574f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc1,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_0011574f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_0010f399;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010f494:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_37.br.x = -10.0;
    r_37.tl.x = -20.0;
    r_37.tl.y = -20.0;
    r_37.br.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_37);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_0011576e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0011576e;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) goto LAB_0010f494;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -30.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)
      ) || (NAN(fVar8))) {
LAB_0010f599:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_38.br.x = -20.0;
    r_38.br.y = 0.0;
    r_38.tl.x = -30.0;
    r_38.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_38);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -30.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_0011578d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) goto LAB_0011578d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010f599;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -40.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010f6a1:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_39.br.x = -30.0;
    r_39.br.y = 0.0;
    r_39.tl.x = -40.0;
    r_39.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_39);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -40.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_001157ac:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_001157ac;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010f6a1;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,40.0,-20.0,0.0,0.0,1,4,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 0.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
      (NAN(fVar8))))) {
LAB_0010f7d2:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_40.br.x = 10.0;
    r_40.br.y = 0.0;
    r_40.tl.x = 0.0;
    r_40.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_40);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
        (NAN(fVar8))))) {
LAB_001157cb:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc6,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_001157cb;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) goto LAB_0010f7d2;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0))
     || (NAN(fVar8))) {
LAB_0010f8d6:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_41.br.x = 20.0;
    r_41.br.y = 0.0;
    r_41.tl.x = 10.0;
    r_41.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_41);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_001157ea:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,199,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) goto LAB_001157ea;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010f8d6;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010f9dc:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_42.br.x = 30.0;
    r_42.br.y = 0.0;
    r_42.tl.x = 20.0;
    r_42.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_42);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115809:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,200,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00115809;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0010f9dc;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 30.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0010fae4:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_43.br.x = 40.0;
    r_43.br.y = 0.0;
    r_43.tl.x = 30.0;
    r_43.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_43);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 30.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_00115828:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 40.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00115828;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 40.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) goto LAB_0010fae4;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,48.0,22.0,0.0,0.0,1,4,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0)) ||
     (NAN(fVar8))) {
LAB_0010fc20:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_44.br.x = 11.0;
    r_44.br.y = 21.0;
    r_44.tl.x = 1.0;
    r_44.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_44);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
        (NAN(fVar8))))) {
LAB_00115847:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xcd,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0)) ||
       (NAN(fVar8))) goto LAB_00115847;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_0010fc20;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0010fd28:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_45.br.x = 23.0;
    r_45.br.y = 21.0;
    r_45.tl.x = 13.0;
    r_45.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_45);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 13.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
       || (NAN(fVar8))) {
LAB_00115866:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xce,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115866;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0010fd28;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 25.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0010fe33:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_46.br.x = 35.0;
    r_46.br.y = 21.0;
    r_46.tl.x = 25.0;
    r_46.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_46);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 25.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
       || (NAN(fVar8))) {
LAB_00115885:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xcf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 35.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115885;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 35.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)
        ) || (NAN(fVar8))) goto LAB_0010fe33;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 37.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
     || (NAN(fVar8))) {
LAB_0010ff40:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_47.br.x = 47.0;
    r_47.br.y = 21.0;
    r_47.tl.x = 37.0;
    r_47.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_47);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 37.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
       || (NAN(fVar8))) {
LAB_001158a4:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd0,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 47.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)
        ) || (NAN(fVar8))) goto LAB_001158a4;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0010ff40;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-48.0,22.0,0.0,0.0,1,4,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
      (NAN(fVar8))))) {
LAB_00110081:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_48.br.x = -1.0;
    r_48.br.y = 21.0;
    r_48.tl.x = -11.0;
    r_48.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_48);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0)) ||
       (NAN(fVar8))) {
LAB_001158c3:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd2,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_001158c3;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_00110081;
  }
  pRVar2 = r[0];
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_0011018e:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_49.br.x = -13.0;
    r_49.br.y = 21.0;
    r_49.tl.x = -23.0;
    r_49.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_49);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_001158e2:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_001158e2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)) || (NAN(fVar8))) goto LAB_0011018e;
  }
  pRVar3 = r[1];
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -35.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
     || (NAN(fVar8))) {
LAB_0011029b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_50.br.x = -25.0;
    r_50.br.y = 21.0;
    r_50.tl.x = -35.0;
    r_50.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_50);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -35.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_00115901:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -25.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)) || (NAN(fVar8))) goto LAB_00115901;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_0011029b;
  }
  pRVar4 = r[2];
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -47.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_001103aa:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_51.br.x = -37.0;
    r_51.br.y = 21.0;
    r_51.tl.x = -47.0;
    r_51.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_51);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -47.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0)
        ) || (NAN(fVar8))) {
LAB_00115920:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd5,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -37.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115920;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -37.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_001103aa;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-48.0,-22.0,0.0,0.0,1,4,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
      (NAN(fVar8))))) {
LAB_001104eb:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_52.br.x = -1.0;
    r_52.br.y = -1.0;
    r_52.tl.x = -11.0;
    r_52.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_52);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
        (NAN(fVar8))))) {
LAB_0011593f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd7,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_0011593f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0)) ||
       (NAN(fVar8))) goto LAB_001104eb;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)
      ) || (NAN(fVar8))) {
LAB_001105f3:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_53.br.x = -13.0;
    r_53.br.y = -1.0;
    r_53.tl.x = -23.0;
    r_53.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_53);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0011595e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)) || (NAN(fVar8))) goto LAB_0011595e;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_001105f3;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -35.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_001106fc:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_54.br.x = -25.0;
    r_54.br.y = -1.0;
    r_54.tl.x = -35.0;
    r_54.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_54);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -35.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)) || (NAN(fVar8))) {
LAB_0011597d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0011597d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_001106fc;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -47.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00110807:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_55.br.x = -37.0;
    r_55.br.y = -1.0;
    r_55.tl.x = -47.0;
    r_55.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_55);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -47.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)) || (NAN(fVar8))) {
LAB_0011599c:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xda,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -37.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0011599c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -37.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)) || (NAN(fVar8))) goto LAB_00110807;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,48.0,-22.0,0.0,0.0,1,4,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
     (NAN(fVar8))) {
LAB_00110948:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_56.br.x = 11.0;
    r_56.br.y = -1.0;
    r_56.tl.x = 1.0;
    r_56.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_56);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
       (NAN(fVar8))) {
LAB_001159bb:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdc,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0)) ||
       (NAN(fVar8))) goto LAB_001159bb;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_00110948;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00110a51:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_57.br.x = 23.0;
    r_57.br.y = -1.0;
    r_57.tl.x = 13.0;
    r_57.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_57);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)) || (NAN(fVar8))) {
LAB_001159da:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_001159da;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_00110a51;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 25.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00110b5a:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_58.br.x = 35.0;
    r_58.br.y = -1.0;
    r_58.tl.x = 25.0;
    r_58.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_58);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 25.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_001159f9:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xde,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 35.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_001159f9;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 35.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)
        ) || (NAN(fVar8))) goto LAB_00110b5a;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 37.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0))
     || (NAN(fVar8))) {
LAB_00110c65:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_59.br.x = 47.0;
    r_59.br.y = -1.0;
    r_59.tl.x = 37.0;
    r_59.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_59);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 37.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00115a18:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 47.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)
        ) || (NAN(fVar8))) goto LAB_00115a18;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 47.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_00110c65;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 0.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
      (NAN(fVar8))))) {
LAB_00110d9b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)(ZEXT816(0x41a0000041200000) << 0x40));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) {
LAB_00115a37:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe5,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_00115a37;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_00110d9b;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_00110e9d:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_60.br.x = 20.0;
    r_60.br.y = 20.0;
    r_60.tl.x = 10.0;
    r_60.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_60);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_00115a56:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe6,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115a56;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)
        ) || (NAN(fVar8))) goto LAB_00110e9d;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 0.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0))
     || (NAN(fVar8))) {
LAB_00110fa0:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_61.br.x = 10.0;
    r_61.br.y = 40.0;
    r_61.tl.x = 0.0;
    r_61.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_61);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_00115a75:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0)
        ) || (NAN(fVar8))) goto LAB_00115a75;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00110fa0;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_001110ab:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_62.br.x = 20.0;
    r_62.br.y = 40.0;
    r_62.tl.x = 10.0;
    r_62.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_62);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)
        ) || (NAN(fVar8))) {
LAB_00115a94:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00115a94;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_001110ab;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
      (NAN(fVar8))))) {
LAB_001111e0:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_63.br.x = 0.0;
    r_63.br.y = 20.0;
    r_63.tl.x = -10.0;
    r_63.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_63);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) {
LAB_00115ab3:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xea,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_00115ab3;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0)) ||
       (NAN(fVar8))) goto LAB_001111e0;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
     || (NAN(fVar8))) {
LAB_001112e0:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_64.br.x = -10.0;
    r_64.br.y = 20.0;
    r_64.tl.x = -20.0;
    r_64.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_64);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) {
LAB_00115ad2:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xeb,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) goto LAB_00115ad2;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_001112e0;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_001113e4:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_65.br.x = 0.0;
    r_65.br.y = 40.0;
    r_65.tl.x = -10.0;
    r_65.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_65);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) {
LAB_00115af1:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xec,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00115af1;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_001113e4;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_001114ee:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_66.br.x = -10.0;
    r_66.br.y = 40.0;
    r_66.tl.x = -20.0;
    r_66.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_66);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_00115b10:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xed,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00115b10;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0)) || (NAN(fVar8))) goto LAB_001114ee;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0)) ||
     (NAN(fVar8))) {
LAB_0011161f:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)ZEXT816(0xc1a00000c1200000));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
        (NAN(fVar8))))) {
LAB_00115b2f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xef,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) goto LAB_00115b2f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_0011161f;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_0011171a:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_67.br.x = -10.0;
    r_67.tl.x = -20.0;
    r_67.tl.y = -20.0;
    r_67.br.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_67);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115b4e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf0,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00115b4e;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0011171a;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_0011181d:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_68.br.x = 0.0;
    r_68.br.y = -20.0;
    r_68.tl.x = -10.0;
    r_68.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_68);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00115b6d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf1,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00115b6d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 0.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)
        ) || (NAN(fVar8))) goto LAB_0011181d;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0)
      ) || (NAN(fVar8))) {
LAB_00111927:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_69.br.x = -10.0;
    r_69.br.y = -20.0;
    r_69.tl.x = -20.0;
    r_69.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_69);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00115b8c:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) goto LAB_00115b8c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00111927;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 0.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
      (NAN(fVar8))))) {
LAB_00111a5c:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_70.br.x = 10.0;
    r_70.br.y = 0.0;
    r_70.tl.x = 0.0;
    r_70.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_70);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0)) ||
       (NAN(fVar8))) {
LAB_00115bab:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf4,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_00115bab;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_00111a5c;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_00111b60:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_71.br.x = 20.0;
    r_71.br.y = 0.0;
    r_71.tl.x = 10.0;
    r_71.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_71);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115bca:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf5,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00115bca;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) goto LAB_00111b60;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 0.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0))
     || (NAN(fVar8))) {
LAB_00111c64:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_72.br.x = 10.0;
    r_72.br.y = -20.0;
    r_72.tl.x = 0.0;
    r_72.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_72);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 0.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0)
        ) || (NAN(fVar8))) {
LAB_00115be9:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf6,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) goto LAB_00115be9;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00111c64;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00111d6f:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_73.br.x = 20.0;
    r_73.br.y = -20.0;
    r_73.tl.x = 10.0;
    r_73.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_73);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0)) || (NAN(fVar8))) {
LAB_00115c08:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00115c08;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00111d6f;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
      (NAN(fVar8))))) {
LAB_00111eaf:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_74.br.x = 11.0;
    r_74.br.y = 21.0;
    r_74.tl.x = 1.0;
    r_74.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_74);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
        (NAN(fVar8))))) {
LAB_00115c27:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfb,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_00115c27;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0)) ||
       (NAN(fVar8))) goto LAB_00111eaf;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 13.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
     || (NAN(fVar8))) {
LAB_00111fb7:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_75.br.x = 23.0;
    r_75.br.y = 21.0;
    r_75.tl.x = 13.0;
    r_75.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_75);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_00115c46:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfc,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)
        ) || (NAN(fVar8))) goto LAB_00115c46;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00111fb7;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_001120c0:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_76.br.x = 11.0;
    r_76.br.y = 43.0;
    r_76.tl.x = 1.0;
    r_76.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_76);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 1.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0))
       || (NAN(fVar8))) {
LAB_00115c65:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_00115c65;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_001120c0;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_001121cb:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_77.br.x = 23.0;
    r_77.br.y = 43.0;
    r_77.tl.x = 13.0;
    r_77.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_77);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_00115c84:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfe,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_00115c84;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0)
        ) || (NAN(fVar8))) goto LAB_001121cb;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0)) ||
     (NAN(fVar8))) {
LAB_0011230b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_78.br.x = -1.0;
    r_78.br.y = 21.0;
    r_78.tl.x = -11.0;
    r_78.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_78);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
        (NAN(fVar8))))) {
LAB_00115ca3:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x100,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0)) ||
       (NAN(fVar8))) goto LAB_00115ca3;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_0011230b;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_00112414:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_79.br.x = -13.0;
    r_79.br.y = 21.0;
    r_79.tl.x = -23.0;
    r_79.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_79);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0)
        ) || (NAN(fVar8))) {
LAB_00115cc2:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x101,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00115cc2;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00112414;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_0011251d:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_80.br.x = -1.0;
    r_80.br.y = 43.0;
    r_80.tl.x = -11.0;
    r_80.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_80);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0)) || (NAN(fVar8))) {
LAB_00115ce1:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x102,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_00115ce1;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -1.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0)
        ) || (NAN(fVar8))) goto LAB_0011251d;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0))
     || (NAN(fVar8))) {
LAB_00112628:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_81.br.x = -13.0;
    r_81.br.y = 43.0;
    r_81.tl.x = -23.0;
    r_81.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_81);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -23.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0)) || (NAN(fVar8))) {
LAB_00115d00:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x103,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0)) || (NAN(fVar8))) goto LAB_00115d00;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_00112628;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
      (NAN(fVar8))))) {
LAB_00112768:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_82.br.x = -1.0;
    r_82.br.y = -1.0;
    r_82.tl.x = -11.0;
    r_82.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_82);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
       (NAN(fVar8))) {
LAB_00115d1f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x105,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_00115d1f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_00112768;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00112870:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_83.br.x = -13.0;
    r_83.br.y = -1.0;
    r_83.tl.x = -23.0;
    r_83.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_83);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00115d3e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x106,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_00115d3e;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)) || (NAN(fVar8))) goto LAB_00112870;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -11.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)
      ) || (NAN(fVar8))) {
LAB_00112979:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_84.br.x = -1.0;
    r_84.br.y = -23.0;
    r_84.tl.x = -11.0;
    r_84.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_84);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0 || (NAN(fVar8))))) {
LAB_00115d5d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x107,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0)) || (NAN(fVar8))) goto LAB_00115d5d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00112979;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0 || (NAN(fVar8))))) {
LAB_00112a84:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_85.br.x = -13.0;
    r_85.br.y = -23.0;
    r_85.tl.x = -23.0;
    r_85.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_85);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -23.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)) || (NAN(fVar8))) {
LAB_00115d7c:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x108,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00115d7c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00112a84;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
      (NAN(fVar8))))) {
LAB_00112bc4:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_86.br.x = 11.0;
    r_86.br.y = -1.0;
    r_86.tl.x = 1.0;
    r_86.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_86);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
        (NAN(fVar8))))) {
LAB_00115d9b:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10a,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_00115d9b;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0)) ||
       (NAN(fVar8))) goto LAB_00112bc4;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 13.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0))
     || (NAN(fVar8))) {
LAB_00112ccd:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_87.br.x = 23.0;
    r_87.br.y = -1.0;
    r_87.tl.x = 13.0;
    r_87.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_87);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00115dba:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10b,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)
        ) || (NAN(fVar8))) goto LAB_00115dba;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_00112ccd;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0 || (NAN(fVar8))))) {
LAB_00112dd6:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_88.br.x = 11.0;
    r_88.br.y = -23.0;
    r_88.tl.x = 1.0;
    r_88.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_88);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 1.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)
        ) || (NAN(fVar8))) {
LAB_00115dd9:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00115dd9;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00112dd6;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0 || (NAN(fVar8))))) {
LAB_00112ee1:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_89.br.x = 23.0;
    r_89.br.y = -23.0;
    r_89.tl.x = 13.0;
    r_89.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_89);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)) || (NAN(fVar8))) {
LAB_00115df8:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00115df8;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0)) || (NAN(fVar8))) goto LAB_00112ee1;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,20.0,40.0,0.0,0.0,2,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
     (NAN(fVar8))) {
LAB_00113017:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)(ZEXT816(0x41a0000041200000) << 0x40));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) {
LAB_00115e17:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x111,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0)) ||
       (NAN(fVar8))) goto LAB_00115e17;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_00113017;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_00113119:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_90.br.x = 20.0;
    r_90.br.y = 20.0;
    r_90.tl.x = 10.0;
    r_90.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_90);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0))
       || (NAN(fVar8))) {
LAB_00115e36:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x112,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115e36;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00113119;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 0.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_0011321c:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_91.br.x = 10.0;
    r_91.br.y = 40.0;
    r_91.tl.x = 0.0;
    r_91.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_91);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_00115e55:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x113,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00115e55;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0)
        ) || (NAN(fVar8))) goto LAB_0011321c;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0))
     || (NAN(fVar8))) {
LAB_00113327:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_92.br.x = 20.0;
    r_92.br.y = 40.0;
    r_92.tl.x = 10.0;
    r_92.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_92);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_00115e74:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x114,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0)
        ) || (NAN(fVar8))) goto LAB_00115e74;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00113327;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-20.0,40.0,0.0,0.0,2,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0 ||
      (NAN(fVar8))))) {
LAB_0011345c:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_93.br.x = 0.0;
    r_93.br.y = 20.0;
    r_93.tl.x = -10.0;
    r_93.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_93);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) {
LAB_00115e93:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x116,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_00115e93;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 20.0 ||
        (NAN(fVar8))))) goto LAB_0011345c;
  }
  uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_0011355c:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_94.br.x = -10.0;
    r_94.br.y = 20.0;
    r_94.tl.x = -20.0;
    r_94.tl.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_94);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) {
LAB_00115eb2:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x117,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) goto LAB_00115eb2;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) goto LAB_0011355c;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0))
     || (NAN(fVar8))) {
LAB_00113660:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_95.br.x = 0.0;
    r_95.br.y = 40.0;
    r_95.tl.x = -10.0;
    r_95.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_95);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_00115ed1:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x118,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 0.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0))
       || (NAN(fVar8))) goto LAB_00115ed1;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00113660;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0 || (NAN(fVar8))))) {
LAB_0011376a:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34
                                );
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_96.br.x = -10.0;
    r_96.br.y = 40.0;
    r_96.tl.x = -20.0;
    r_96.tl.y = 20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_96);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 20.0)) || (NAN(fVar8))) {
LAB_00115ef0:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x119,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_00115ef0;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 40.0 || (NAN(fVar8))))) goto LAB_0011376a;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-20.0,-40.0,0.0,0.0,2,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
      (NAN(fVar8))))) {
LAB_0011389f:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 (rect2d)ZEXT816(0xc1a00000c1200000));
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0)) ||
       (NAN(fVar8))) {
LAB_00115f0f:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11b,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_00115f0f;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) goto LAB_0011389f;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -20.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)
      ) || (NAN(fVar8))) {
LAB_0011399e:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_97.br.x = -10.0;
    r_97.tl.x = -20.0;
    r_97.tl.y = -20.0;
    r_97.br.y = 0.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_97);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115f2e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0)
        ) || (NAN(fVar8))) goto LAB_00115f2e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_0011399e;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00113aa7:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_98.br.x = 0.0;
    r_98.br.y = -20.0;
    r_98.tl.x = -10.0;
    r_98.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_98);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0)) || (NAN(fVar8))) {
LAB_00115f4d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00115f4d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00113aa7;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -20.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00113bb7:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_99.br.x = -10.0;
    r_99.br.y = -20.0;
    r_99.tl.x = -20.0;
    r_99.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_99);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00115f6c:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00115f6c;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) goto LAB_00113bb7;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,20.0,-40.0,0.0,0.0,2,2,0.0,0.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0)) ||
     (NAN(fVar8))) {
LAB_00113ce8:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00100.br.x = 10.0;
    r_x00100.br.y = 0.0;
    r_x00100.tl.x = 0.0;
    r_x00100.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00100);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -20.0 ||
        (NAN(fVar8))))) {
LAB_00115f8b:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x120,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0)) ||
       (NAN(fVar8))) goto LAB_00115f8b;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 0.0 ||
        (NAN(fVar8))))) goto LAB_00113ce8;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 10.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) {
LAB_00113dec:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00101.br.x = 20.0;
    r_x00101.br.y = 0.0;
    r_x00101.tl.x = 10.0;
    r_x00101.tl.y = -20.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00101);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) {
LAB_00115faa:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x121,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00115faa;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 0.0 || (NAN(fVar8))))) goto LAB_00113dec;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 0.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00113ef2:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00102.br.x = 10.0;
    r_x00102.br.y = -20.0;
    r_x00102.tl.x = 0.0;
    r_x00102.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00102);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 0.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00115fc9:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x122,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00115fc9;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 10.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) goto LAB_00113ef2;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 10.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0))
     || (NAN(fVar8))) {
LAB_00113fff:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00103.br.x = 20.0;
    r_x00103.br.y = -20.0;
    r_x00103.tl.x = 10.0;
    r_x00103.tl.y = -40.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00103);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 10.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -40.0 || (NAN(fVar8))))) {
LAB_00115fe8:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x123,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 20.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0)) || (NAN(fVar8))) goto LAB_00115fe8;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 20.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -20.0 || (NAN(fVar8))))) goto LAB_00113fff;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,24.0,44.0,0.0,0.0,2,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
      (NAN(fVar8))))) {
LAB_0011413b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00104.br.x = 11.0;
    r_x00104.br.y = 21.0;
    r_x00104.tl.x = 1.0;
    r_x00104.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00104);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0)) ||
       (NAN(fVar8))) {
LAB_00116007:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x127,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_00116007;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_0011413b;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_00114243:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00105.br.x = 23.0;
    r_x00105.br.y = 21.0;
    r_x00105.tl.x = 13.0;
    r_x00105.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00105);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 13.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
       || (NAN(fVar8))) {
LAB_00116026:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x128,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_00116026;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)
        ) || (NAN(fVar8))) goto LAB_00114243;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 1.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0))
     || (NAN(fVar8))) {
LAB_0011434e:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00106.br.x = 11.0;
    r_x00106.br.y = 43.0;
    r_x00106.tl.x = 1.0;
    r_x00106.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00106);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 1.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0))
       || (NAN(fVar8))) {
LAB_00116045:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x129,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 11.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0)
        ) || (NAN(fVar8))) goto LAB_00116045;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_0011434e;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_0011445b:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00107.br.x = 23.0;
    r_x00107.br.y = 43.0;
    r_x00107.tl.x = 13.0;
    r_x00107.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00107);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 13.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0)
        ) || (NAN(fVar8))) {
LAB_00116064:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12a,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_00116064;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_0011445b;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-24.0,44.0,0.0,0.0,2,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
      (NAN(fVar8))))) {
LAB_00114597:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00108.br.x = -1.0;
    r_x00108.br.y = 21.0;
    r_x00108.tl.x = -11.0;
    r_x00108.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00108);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != 1.0 ||
        (NAN(fVar8))))) {
LAB_00116083:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,300,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0 ||
        (NAN(fVar8))))) goto LAB_00116083;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != 21.0)) ||
       (NAN(fVar8))) goto LAB_00114597;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0))
     || (NAN(fVar8))) {
LAB_001146a0:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00109.br.x = -13.0;
    r_x00109.br.y = 21.0;
    r_x00109.tl.x = -23.0;
    r_x00109.tl.y = 1.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00109);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 1.0 || (NAN(fVar8))))) {
LAB_001160a2:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0)) || (NAN(fVar8))) goto LAB_001160a2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 21.0 || (NAN(fVar8))))) goto LAB_001146a0;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_001147ab:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00110.br.x = -1.0;
    r_x00110.br.y = 43.0;
    r_x00110.tl.x = -11.0;
    r_x00110.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00110);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0)) || (NAN(fVar8))) {
LAB_001160c1:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_001160c1;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_001147ab;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_001148b8:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00111.br.x = -13.0;
    r_x00111.br.y = 43.0;
    r_x00111.tl.x = -23.0;
    r_x00111.tl.y = 23.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00111);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != -23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 23.0 || (NAN(fVar8))))) {
LAB_001160e0:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12f,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0 || (NAN(fVar8))))) goto LAB_001160e0;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != 43.0)) || (NAN(fVar8))) goto LAB_001148b8;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-24.0,-44.0,0.0,0.0,2,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
      (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
     (NAN(fVar8))) {
LAB_001149f4:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00112.br.x = -1.0;
    r_x00112.br.y = -1.0;
    r_x00112.tl.x = -11.0;
    r_x00112.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00112);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if (((fVar8 != -11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
        (NAN(fVar8))))) {
LAB_001160ff:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x131,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0)) ||
       (NAN(fVar8))) goto LAB_001160ff;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_001149f4;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -23.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00114afc:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00113.br.x = -13.0;
    r_x00113.br.y = -1.0;
    r_x00113.tl.x = -23.0;
    r_x00113.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00113);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -23.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0)) || (NAN(fVar8))) {
LAB_0011611e:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x132,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0011611e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_00114afc;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != -11.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0 || (NAN(fVar8))))) {
LAB_00114c07:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00114.br.x = -1.0;
    r_x00114.br.y = -23.0;
    r_x00114.tl.x = -11.0;
    r_x00114.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00114);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)) || (NAN(fVar8))) {
LAB_0011613d:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x133,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_0011613d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0)) || (NAN(fVar8))) goto LAB_00114c07;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != -23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)
      ) || (NAN(fVar8))) {
LAB_00114d14:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00115.br.x = -13.0;
    r_x00115.br.y = -23.0;
    r_x00115.tl.x = -23.0;
    r_x00115.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00115);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -23.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0)) || (NAN(fVar8))) {
LAB_0011615c:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x134,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != -13.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0)) || (NAN(fVar8))) goto LAB_0011615c;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != -13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00114d14;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,24.0,-44.0,0.0,0.0,2,2,1.0,2.0);
  fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
  if (((fVar8 != 1.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0 ||
      (NAN(fVar8))))) {
LAB_00114e50:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)((long)local_58 + 0x34));
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00116.br.x = 11.0;
    r_x00116.br.y = -1.0;
    r_x00116.tl.x = 1.0;
    r_x00116.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00116);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x34);
    if ((((fVar8 != 1.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x34) >> 0x20), fVar8 != -21.0)) ||
       (NAN(fVar8))) {
LAB_0011617b:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x136,"void tst_layoutnode_horizontal_grid()");
    }
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_0011617b;
  }
  else {
    fVar8 = (float)*(undefined8 *)((long)local_58 + 0x3c);
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)*(undefined8 *)((long)local_58 + 0x3c) >> 0x20), fVar8 != -1.0 ||
        (NAN(fVar8))))) goto LAB_00114e50;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 != 13.0) || (NAN(fVar8))) ||
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_00114f59:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00117.br.x = 23.0;
    r_x00117.br.y = -1.0;
    r_x00117.tl.x = 13.0;
    r_x00117.tl.y = -21.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00117);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 13.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -21.0 || (NAN(fVar8))))) {
LAB_0011619a:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x137,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 23.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0 || (NAN(fVar8))))) goto LAB_0011619a;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 23.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -1.0)
        ) || (NAN(fVar8))) goto LAB_00114f59;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 != 1.0) || (NAN(fVar8))) || (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0))
     || (NAN(fVar8))) {
LAB_00115064:
    pcVar6 = "Not equal \'";
    poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                                 *(rect2d *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34);
    pcVar6 = "\' vs \'";
    poVar5 = std::operator<<(poVar5,"\' vs \'");
    r_x00118.br.x = 11.0;
    r_x00118.br.y = -23.0;
    r_x00118.tl.x = 1.0;
    r_x00118.tl.y = -43.0;
    poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00118);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar8 = (float)uVar1;
    if (((fVar8 != 1.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -43.0 || (NAN(fVar8))))) {
LAB_001161b9:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x138,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if ((((fVar8 != 11.0) || (NAN(fVar8))) ||
        (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0)) || (NAN(fVar8))) goto LAB_001161b9;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 != 11.0) || (NAN(fVar8))) ||
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 != -23.0 || (NAN(fVar8))))) goto LAB_00115064;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if (((fVar8 == 13.0) && (!NAN(fVar8))) &&
     ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 == -43.0 && (!NAN(fVar8))))) {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 == 23.0) && (!NAN(fVar8))) &&
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 == -23.0 && (!NAN(fVar8)))))
    goto LAB_00115236;
  }
  pcVar6 = "Not equal \'";
  poVar5 = std::operator<<((ostream *)&std::cout,"Not equal \'");
  poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,
                               *(rect2d *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34);
  pcVar6 = "\' vs \'";
  poVar5 = std::operator<<(poVar5,"\' vs \'");
  r_x00119.br.x = 23.0;
  r_x00119.br.y = -23.0;
  r_x00119.tl.x = 13.0;
  r_x00119.tl.y = -43.0;
  poVar5 = rengine::operator<<((rengine *)poVar5,(ostream *)pcVar6,r_x00119);
  poVar5 = std::operator<<(poVar5,"\'");
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar8 = (float)uVar1;
  if ((((fVar8 == 13.0) && (!NAN(fVar8))) && (fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 == -43.0)
      ) && (!NAN(fVar8))) {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar8 = (float)uVar1;
    if (((fVar8 == 23.0) && (!NAN(fVar8))) &&
       ((fVar8 = (float)((ulong)uVar1 >> 0x20), fVar8 == -23.0 && (!NAN(fVar8))))) {
LAB_00115236:
      poVar5 = std::operator<<((ostream *)&std::cout,"void tst_layoutnode_horizontal_grid()");
      poVar5 = std::operator<<(poVar5,": ok");
      std::endl<char,std::char_traits<char>>(poVar5);
      (*(this->super_SignalEmitter)._vptr_SignalEmitter[2])(this);
      return;
    }
  }
  __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, -43, 10, 20))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                ,0x139,"void tst_layoutnode_horizontal_grid()");
}

Assistant:

void tst_layoutnode_horizontal_grid()
{
    LayoutNode *root = LayoutNode::create();
    root->setActivationMode(LayoutNode::Explicit);
    root->setLayoutType(LayoutEngine::Grid_Horizontal);

    RectangleNode *r[4];
    for (int i=0; i<4; ++i) {
        r[i] = RectangleNode::create();
        root->append(r[i]);
    }

    // cellsize, one row
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, -20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, -20, 10, 20));

    // cellsize, margin/spacing
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, -21, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, -21, 10, 20));

    // width/height, 1x4 grid
    apply_w_h_cw_ch_r_c_m_s(root, 40, 20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -40, 20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -40, -20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, -20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 40, -20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, -20, 10, 20));

    // width/height, 1x4 grid, space/margin
    apply_w_h_cw_ch_r_c_m_s(root, 48, 22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -48, 22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -48, -22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, -21, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 48, -22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, -21, 10, 20));

    // And then all the same tests, but this time limited to 2 columns

    // cell size, 2 columns
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, -40, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, -40, 10, 20));

    // cell size, space/margin, 2 cols
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, -43, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, -43, 10, 20));

    // width/height, 2x2 grid
    apply_w_h_cw_ch_r_c_m_s(root, 20, 40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0,  0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10,  0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -20, 40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10,  0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20,  0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -20, -40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, -40, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 20, -40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, -40, 10, 20));

    // width/height, 2x2 grid
    apply_w_h_cw_ch_r_c_m_s(root, 24, 44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -24, 44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -24, -44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, -43, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 24, -44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, -43, 10, 20));


    cout << __PRETTY_FUNCTION__ << ": ok" << endl;

    root->destroy();
}